

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O0

string * __thiscall options2f::help_abi_cxx11_(options2f *this,char *prog)

{
  undefined1 *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_1b9 [33];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  *in_RSI = 0;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1b9 + 1),"Free energy of ferromagnetic Ising model\n",
             (allocator *)__lhs);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string((string *)(local_1b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b9);
  return in_RDI;
}

Assistant:

std::string help(char *prog) {
    valid = false;
    return std::string("Free energy of ferromagnetic Ising model\n") +
           "Usage: " + prog + " [-p prec] L T\n" + "       " + prog +
           " [-p prec] L J T\n" + "       " + prog +
           " [-p prec] Lx Ly Jx Jy T\n" + "       " + prog +
           " [-p prec] Lx Ly Jx Jy Tmin Tmax dT\n" +
           "Note: T can be specified as \"tc\" instead of real numbers\n";
  }